

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void __thiscall asmjit::CodeHolder::CodeHolder(CodeHolder *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 7) = 0;
  *(undefined8 *)(in_RDI + 2) = 0xffffffffffffffff;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  Zone::Zone((Zone *)(in_RDI + 0x10),0x3fc0,0);
  Zone::Zone((Zone *)(in_RDI + 0x18),0x3fc0,0);
  memset(in_RDI + 0x20,0,0x60);
  *(undefined4 **)(in_RDI + 0x20) = in_RDI + 0x10;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x3a) = 0;
  *(undefined8 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x3e) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  *(undefined8 *)(in_RDI + 0x44) = 0;
  *(undefined8 *)(in_RDI + 0x46) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined4 **)(in_RDI + 0x4a) = in_RDI + 0x20;
  *(undefined8 *)(in_RDI + 0x4c) = 0;
  in_RDI[0x4e] = 1;
  in_RDI[0x4f] = 1;
  *(undefined4 **)(in_RDI + 0x50) = in_RDI + 0x52;
  *(undefined8 *)(in_RDI + 0x52) = 0;
  return;
}

Assistant:

CodeHolder::CodeHolder() noexcept
  : _codeInfo(),
    _globalHints(0),
    _globalOptions(0),
    _emitters(nullptr),
    _cgAsm(nullptr),
    _logger(nullptr),
    _errorHandler(nullptr),
    _unresolvedLabelsCount(0),
    _trampolinesSize(0),
    _baseZone(16384 - Zone::kZoneOverhead),
    _dataZone(16384 - Zone::kZoneOverhead),
    _baseHeap(&_baseZone),
    _namedLabels(&_baseHeap) {}